

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_read_subregion_image(nifti_image *nim,int *start_index,int *region_size,void **data)

{
  uint uVar1;
  znzFile file;
  long lVar2;
  void *pvVar3;
  size_t sVar4;
  int read_amount;
  int nread;
  int rs [7];
  int local_e4;
  int si [7];
  long offset;
  long initial_offset;
  int *image_size;
  int collapsed_dims [8];
  int strides [7];
  char *readptr;
  int total_alloc_size;
  long bytes;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  znzFile fp;
  void **data_local;
  int *region_size_local;
  int *start_index_local;
  nifti_image *nim_local;
  
  nim_local._4_4_ = 0;
  image_size._0_4_ = nim->ndim;
  for (k = 0; k < nim->ndim; k = k + 1) {
    if ((start_index[k] == 0) && (region_size[k] == nim->dim[k + 1])) {
      collapsed_dims[(long)(k + 1) + -2] = -1;
    }
    else if (region_size[k] == 1) {
      collapsed_dims[(long)(k + 1) + -2] = start_index[k];
    }
    else {
      collapsed_dims[(long)(k + 1) + -2] = -2;
    }
  }
  for (k = nim->ndim; k < 7; k = k + 1) {
    collapsed_dims[(long)(k + 1) + -2] = -1;
  }
  k = 1;
  while ((k <= nim->ndim && (collapsed_dims[(long)k + -2] != -2))) {
    k = k + 1;
  }
  if (nim->ndim < k) {
    nim_local._4_4_ = nifti_read_collapsed_image(nim,(int *)&image_size,data);
  }
  else {
    for (k = 0; k < nim->ndim; k = k + 1) {
      if ((nim->dim + 1)[k] < start_index[k] + region_size[k]) {
        if (1 < g_opts.debug) {
          fprintf(_stderr,"region doesn\'t fit within image size\n");
        }
        return -1;
      }
    }
    file = nifti_image_load_prep(nim);
    lVar2 = znztell(file);
    compute_strides(collapsed_dims + 6,nim->dim + 1,nim->nbyper);
    readptr._4_4_ = nim->nbyper;
    for (k = 0; k < nim->ndim; k = k + 1) {
      readptr._4_4_ = region_size[k] * readptr._4_4_;
    }
    if (*data == (void *)0x0) {
      pvVar3 = malloc((long)(int)readptr._4_4_);
      *data = pvVar3;
    }
    if ((*data == (void *)0x0) && (1 < g_opts.debug)) {
      fprintf(_stderr,"allocation of %d bytes failed\n",(ulong)readptr._4_4_);
      nim_local._4_4_ = -1;
    }
    else {
      unique0x00012000 = *data;
      for (k = 0; k < nim->ndim; k = k + 1) {
        rs[(long)k + 6] = start_index[k];
        (&read_amount)[k] = region_size[k];
      }
      for (k = nim->ndim; k < 7; k = k + 1) {
        rs[(long)k + 6] = 0;
        (&read_amount)[k] = 1;
      }
      for (k = si[4]; k < si[4] + rs[4]; k = k + 1) {
        for (l = si[3]; l < si[3] + rs[3]; l = l + 1) {
          for (m = si[2]; m < si[2] + rs[2]; m = m + 1) {
            for (n = si[1]; n < si[1] + rs[1]; n = n + 1) {
              for (bytes._4_4_ = si[0]; bytes._4_4_ < si[0] + rs[0]; bytes._4_4_ = bytes._4_4_ + 1)
              {
                for (bytes._0_4_ = local_e4; (int)bytes < local_e4 + nread;
                    bytes._0_4_ = (int)bytes + 1) {
                  znzseek(file,lVar2 + k * strides[4] + (long)(l * strides[3]) +
                               (long)(m * strides[2]) + (long)(n * strides[1]) +
                               (long)(bytes._4_4_ * strides[0]) +
                               (long)((int)bytes * collapsed_dims[7]) +
                               (long)(rs[6] * collapsed_dims[6]),0);
                  uVar1 = read_amount * nim->nbyper;
                  sVar4 = nifti_read_buffer(file,stack0xffffffffffffff98,(long)(int)uVar1,nim);
                  if (((uint)sVar4 != uVar1) && (1 < g_opts.debug)) {
                    fprintf(_stderr,"read of %d bytes failed\n",(ulong)uVar1);
                    return -1;
                  }
                  nim_local._4_4_ = (uint)sVar4 + nim_local._4_4_;
                  register0x00000000 = (void *)((long)stack0xffffffffffffff98 + (long)(int)uVar1);
                }
              }
            }
          }
        }
      }
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_read_subregion_image( nifti_image * nim,
                                int *start_index,
                                int *region_size,
                                void ** data )
{
  znzFile fp;                   /* file to read */
  int i,j,k,l,m,n;              /* indices for dims */
  long int bytes = 0;           /* total # bytes read */
  int total_alloc_size;         /* size of buffer allocation */
  char *readptr;                /* where in *data to read next */
  int strides[7];               /* strides between dimensions */
  int collapsed_dims[8];        /* for read_collapsed_image */
  int *image_size;              /* pointer to dimensions in header */
  long int initial_offset;
  long int offset;              /* seek offset for reading current row */

  /* probably ignored, but set to ndim for consistency*/
  collapsed_dims[0] = nim->ndim;

  /* build a dims array for collapsed image read */
  for(i = 0; i < nim->ndim; i++)
    {
    /* if you take the whole extent in this dimension */
    if(start_index[i] == 0 &&
       region_size[i] == nim->dim[i+1])
      {
      collapsed_dims[i+1] = -1;
      }
    /* if you specify a single element in this dimension */
    else if(region_size[i] == 1)
      {
      collapsed_dims[i+1] = start_index[i];
      }
    else
      {
      collapsed_dims[i+1] = -2; /* sentinel value */
      }
    }
  /* fill out end of collapsed_dims */
  for(i = nim->ndim ; i < 7; i++)
    {
    collapsed_dims[i+1] = -1;
    }

  /* check to see whether collapsed read is possible */
  for(i = 1; i <= nim->ndim; i++)
    {
    if(collapsed_dims[i] == -2)
      {
      break;
      }
    }

  /* if you get through all the dimensions without hitting
  ** a subrange of size > 1, a collapsed read is possible
  */
  if(i > nim->ndim)
    {
    return nifti_read_collapsed_image(nim, collapsed_dims, data);
    }

  /* point past first element of dim, which holds nim->ndim */
  image_size = &(nim->dim[1]);

  /* check region sizes for sanity */
  for(i = 0; i < nim->ndim; i++)
    {
    if(start_index[i]  + region_size[i] > image_size[i])
      {
      if(g_opts.debug > 1)
        {
        fprintf(stderr,"region doesn't fit within image size\n");
        }
      return -1;
      }
    }

  /* get the file open */
  fp = nifti_image_load_prep( nim );
  /* the current offset is just past the nifti header, save
   * location so that SEEK_SET can be used below
   */
  initial_offset = znztell(fp);
  /* get strides*/
  compute_strides(strides,image_size,nim->nbyper);

  total_alloc_size = nim->nbyper; /* size of pixel */

  /* find alloc size */
  for(i = 0; i < nim->ndim; i++)
    {
    total_alloc_size *= region_size[i];
    }
  /* allocate buffer, if necessary */
  if(*data == 0)
    {
    *data = (void *)malloc(total_alloc_size);
    }

  if(*data == 0)
    {
    if(g_opts.debug > 1)
      {
      fprintf(stderr,"allocation of %d bytes failed\n",total_alloc_size);
      return -1;
      }
    }

  /* point to start of data buffer as char * */
  readptr = *((char **)data);
  {
  /* can't assume that start_index and region_size have any more than
  ** nim->ndim elements so make local copies, filled out to seven elements
  */
  int si[7], rs[7];
  for(i = 0; i < nim->ndim; i++)
    {
    si[i] = start_index[i];
    rs[i] = region_size[i];
    }
  for(i = nim->ndim; i < 7; i++)
    {
    si[i] = 0;
    rs[i] = 1;
    }
  /* loop through subregion and read a row at a time */
  for(i = si[6]; i < (si[6] + rs[6]); i++)
    {
    for(j = si[5]; j < (si[5] + rs[5]); j++)
      {
      for(k = si[4]; k < (si[4] + rs[4]); k++)
        {
        for(l = si[3]; l < (si[3] + rs[3]); l++)
          {
          for(m = si[2]; m < (si[2] + rs[2]); m++)
            {
            for(n = si[1]; n < (si[1] + rs[1]); n++)
              {
              int nread,read_amount;
              offset = initial_offset +
                (i * strides[6]) +
                (j * strides[5]) +
                (k * strides[4]) +
                (l * strides[3]) +
                (m * strides[2]) +
                (n * strides[1]) +
                (si[0] * strides[0]);
              znzseek(fp, offset, SEEK_SET); /* seek to current row */
              read_amount = rs[0] * nim->nbyper; /* read a row of the subregion*/
              nread = (int)nifti_read_buffer(fp, readptr, read_amount, nim);
              if(nread != read_amount)
                {
                if(g_opts.debug > 1)
                  {
                  fprintf(stderr,"read of %d bytes failed\n",read_amount);
                  return -1;
                  }
                }
              bytes += nread;
              readptr += read_amount;
              }
            }
          }
        }
      }
    }
  }
  return bytes;
}